

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O1

elem * __thiscall cilkred_map::lookup(cilkred_map *this,void *key)

{
  bucket *pbVar1;
  void *pvVar2;
  ulong uVar3;
  
  uVar3 = (ulong)key >> 0x15 ^ (ulong)key;
  uVar3 = uVar3 >> 8 ^ uVar3;
  pbVar1 = this->buckets[this->nbuckets - 1 & (uVar3 >> 3 ^ uVar3)];
  if ((pbVar1 != (bucket *)0x0) && (pvVar2 = pbVar1->el[0].key, pvVar2 != (void *)0x0)) {
    pbVar1 = pbVar1 + 1;
    do {
      if (pvVar2 == key) {
        if (pbVar1[-1].el[0].view != (void *)0x0) {
          return pbVar1[-1].el;
        }
        lookup();
      }
      pvVar2 = (void *)pbVar1->nmax;
      pbVar1 = (bucket *)&pbVar1->el[0].view;
    } while (pvVar2 != (void *)0x0);
  }
  return (elem *)0x0;
}

Assistant:

elem *cilkred_map::lookup(void *key)
{
    bucket *b = buckets[hashfun(this, key)];

    if (b) {
        elem *el;
        for (el = b->el; el->key; ++el) {
            if (el->key == key) {
                CILK_ASSERT(el->view);
                return el;
            }
        }
    }

    return 0;
}